

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Lookup
          (PersistentStorageJson *this,BorderRouter *aValue,
          vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          *aRet)

{
  undefined8 uVar1;
  Status SVar2;
  BorderRouter *this_00;
  _Any_data __tmp;
  _Any_data local_238;
  code *local_228;
  code *pcStack_220;
  _Any_data local_218;
  code *local_208;
  code *pcStack_200;
  string local_1f0;
  function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)> local_1d0;
  BorderRouter local_1b0;
  
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = 0;
  pcStack_220 = std::
                _Function_handler<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:386:54)>
                ::_M_invoke;
  local_228 = std::
              _Function_handler<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:386:54)>
              ::_M_manager;
  BorderRouter::BorderRouter(&local_1b0,aValue);
  local_208 = (code *)0x0;
  pcStack_200 = (code *)0x0;
  local_218._M_unused._M_object = (void *)0x0;
  local_218._8_8_ = 0;
  this_00 = (BorderRouter *)operator_new(0x188);
  BorderRouter::BorderRouter(this_00,&local_1b0);
  uVar1 = local_218._8_8_;
  local_208 = local_228;
  local_218._M_unused._M_object = local_238._M_unused._M_object;
  local_218._8_8_ = local_238._8_8_;
  local_238._8_8_ = uVar1;
  local_228 = std::
              _Function_handler<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:388:12)>
              ::_M_manager;
  pcStack_200 = pcStack_220;
  pcStack_220 = std::
                _Function_handler<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:388:12)>
                ::_M_invoke;
  local_238._M_unused._M_object = this_00;
  std::_Function_base::~_Function_base((_Function_base *)&local_218);
  BorderRouter::~BorderRouter(&local_1b0);
  std::function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)>::function
            (&local_1d0,
             (function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)> *)
             &local_238);
  std::__cxx11::string::string((string *)&local_1f0,(string *)JSON_BR_abi_cxx11_);
  SVar2 = LookupPred<ot::commissioner::persistent_storage::BorderRouter>
                    (this,&local_1d0,aRet,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::_Function_base::~_Function_base(&local_1d0.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_238);
  return SVar2;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Lookup(BorderRouter const &aValue, std::vector<BorderRouter> &aRet)
{
    std::function<bool(BorderRouter const &)> pred = [](BorderRouter const &) { return true; };

    pred = [aValue](BorderRouter const &el) {
        bool aRet =
            (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) &&
            (aValue.mNetworkId.mId == EMPTY_ID || (el.mNetworkId.mId == aValue.mNetworkId.mId)) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kAddrBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kAddrBit) != 0 &&
              CaseInsensitiveEqual(el.mAgent.mAddr, aValue.mAgent.mAddr))) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kPortBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kPortBit) != 0 && el.mAgent.mPort == aValue.mAgent.mPort)) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kThreadVersionBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kThreadVersionBit) != 0 &&
              aValue.mAgent.mThreadVersion == el.mAgent.mThreadVersion)) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kStateBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kStateBit) != 0 && el.mAgent.mState == aValue.mAgent.mState)) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) != 0 &&
              CaseInsensitiveEqual(el.mAgent.mVendorName, aValue.mAgent.mVendorName))) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kModelNameBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kModelNameBit) != 0 &&
              CaseInsensitiveEqual(el.mAgent.mModelName, aValue.mAgent.mModelName))) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kActiveTimestampBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kActiveTimestampBit) != 0 &&
              el.mAgent.mActiveTimestamp.Encode() == aValue.mAgent.mActiveTimestamp.Encode())) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kPartitionIdBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kPartitionIdBit) != 0 &&
              el.mAgent.mPartitionId == aValue.mAgent.mPartitionId)) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) != 0 &&
              el.mAgent.mVendorData == aValue.mAgent.mVendorData)) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kVendorOuiBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kVendorOuiBit) != 0 &&
              el.mAgent.mVendorOui == aValue.mAgent.mVendorOui)) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kBbrSeqNumberBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kBbrSeqNumberBit) != 0 &&
              el.mAgent.mBbrSeqNumber == aValue.mAgent.mBbrSeqNumber)) &&
            ((aValue.mAgent.mPresentFlags & BorderAgent::kBbrPortBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kBbrPortBit) != 0 &&
              el.mAgent.mBbrPort == aValue.mAgent.mBbrPort));
        return aRet;
    };

    return LookupPred<BorderRouter>(pred, aRet, JSON_BR);
}